

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::Prog::Flatten(Prog *this)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  pointer pIVar3;
  Inst *__s;
  int iVar4;
  pointer pIVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> flat;
  vector<int,_std::allocator<int>_> flatmap;
  SparseArray<int> rootmap;
  vector<int,_std::allocator<int>_> stk;
  SparseSet q;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> local_c8;
  vector<int,_std::allocator<int>_> local_a8;
  SparseArray<int> local_90;
  undefined1 local_68 [16];
  pointer local_58;
  SparseSet local_48;
  
  if (this->did_flatten_ == false) {
    this->did_flatten_ = true;
    SparseSet::SparseSet(&local_48,this->size_);
    local_68 = (undefined1  [16])0x0;
    local_58 = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_68,(long)this->size_);
    SparseArray<int>::SparseArray(&local_90,this->size_);
    MarkRoots(this,&local_90,&local_48,(vector<int,_std::allocator<int>_> *)local_68);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_a8,(long)local_90.size_,(allocator_type *)&local_c8);
    local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::reserve
              (&local_c8,(long)this->size_);
    if (local_90.size_ != 0) {
      pIVar5 = local_90.dense_.
               super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[pIVar5->second] =
             (int)((ulong)((long)local_c8.
                                 super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c8.
                                super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
        EmitList(this,pIVar5->index_,&local_90,&local_c8,&local_48,
                 (vector<int,_std::allocator<int>_> *)local_68);
        local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].out_opcode_ =
             local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].out_opcode_ | 8;
        pIVar5 = pIVar5 + 1;
      } while (pIVar5 != local_90.dense_.
                         super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                         ._M_impl.super__Vector_impl_data._M_start + local_90.size_);
    }
    this->list_count_ =
         (int)((ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    this->inst_count_[0] = 0;
    this->inst_count_[1] = 0;
    this->inst_count_[2] = 0;
    this->inst_count_[3] = 0;
    this->inst_count_[4] = 0;
    this->inst_count_[5] = 0;
    this->inst_count_[6] = 0;
    this->inst_count_[7] = 0;
    uVar6 = (uint)((ulong)((long)local_c8.
                                 super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c8.
                                super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        uVar1 = local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar7].out_opcode_;
        uVar8 = 1;
        if ((uVar1 & 7) != 1) {
          local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7].out_opcode_ =
               uVar1 & 0xf |
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar1 >> 4] << 4;
          uVar8 = (ulong)(uVar1 & 7);
        }
        this->inst_count_[uVar8] = this->inst_count_[uVar8] + 1;
        uVar7 = uVar7 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
    if (this->inst_count_[7] + this->inst_count_[3] + this->inst_count_[5] + this->inst_count_[1] +
        this->inst_count_[6] + this->inst_count_[2] + this->inst_count_[4] + this->inst_count_[0] !=
        uVar6) {
      __assert_fail("(total) == (static_cast<int>(flat.size()))",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc",
                    0x1b0,"void re2::Prog::Flatten()");
    }
    iVar2 = this->start_unanchored_;
    if (iVar2 == 0) {
      if (this->start_ != 0) {
        __assert_fail("(start()) == (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc"
                      ,0x1b4,"void re2::Prog::Flatten()");
      }
    }
    else {
      iVar4 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[1];
      this->start_unanchored_ = iVar4;
      if (iVar2 != this->start_) {
        iVar4 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2];
      }
      this->start_ = iVar4;
    }
    this->size_ = uVar6;
    if (this->inst_ != (Inst *)0x0) {
      operator_delete__(this->inst_);
      uVar6 = this->size_;
    }
    __n = (long)(int)uVar6 * 8;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar7 = __n;
    }
    __s = (Inst *)operator_new__(uVar7);
    if (uVar6 != 0) {
      memset(__s,0,__n);
    }
    this->inst_ = __s;
    pIVar3 = local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
             super__Vector_impl_data._M_start;
    memmove(__s,local_c8.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                _M_impl.super__Vector_impl_data._M_start,__n);
    if (pIVar3 != (pointer)0x0) {
      operator_delete(pIVar3);
    }
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    SparseArray<int>::~SparseArray(&local_90);
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_);
    }
    SparseSet::~SparseSet(&local_48);
  }
  return;
}

Assistant:

void Prog::Flatten() {
  if (did_flatten_)
    return;
  did_flatten_ = true;

  // Scratch structures. It's important that these are reused by EmitList()
  // because we call it in a loop and it would thrash the heap otherwise.
  SparseSet q(size());
  vector<int> stk;
  stk.reserve(size());

  // First pass: Marks "roots".
  // Builds the mapping from inst-ids to root-ids.
  SparseArray<int> rootmap(size());
  MarkRoots(&rootmap, &q, &stk);

  // Second pass: Emits "lists". Remaps outs to root-ids.
  // Builds the mapping from root-ids to flat-ids.
  vector<int> flatmap(rootmap.size());
  vector<Inst> flat;
  flat.reserve(size());
  for (SparseArray<int>::const_iterator i = rootmap.begin();
       i != rootmap.end();
       ++i) {
    flatmap[i->value()] = static_cast<int>(flat.size());
    EmitList(i->index(), &rootmap, &flat, &q, &stk);
    flat.back().set_last();
  }

  list_count_ = static_cast<int>(flatmap.size());
  for (int i = 0; i < kNumInst; i++)
    inst_count_[i] = 0;

  // Third pass: Remaps outs to flat-ids.
  // Counts instructions by opcode.
  for (int id = 0; id < static_cast<int>(flat.size()); id++) {
    Inst* ip = &flat[id];
    if (ip->opcode() != kInstAltMatch)  // handled in EmitList()
      ip->set_out(flatmap[ip->out()]);
    inst_count_[ip->opcode()]++;
  }

  int total = 0;
  for (int i = 0; i < kNumInst; i++)
    total += inst_count_[i];
  DCHECK_EQ(total, static_cast<int>(flat.size()));

  // Remap start_unanchored and start.
  if (start_unanchored() == 0) {
    DCHECK_EQ(start(), 0);
  } else if (start_unanchored() == start()) {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[1]);
  } else {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[2]);
  }

  // Finally, replace the old instructions with the new instructions.
  size_ = static_cast<int>(flat.size());
  delete[] inst_;
  inst_ = new Inst[size_];
  memmove(inst_, flat.data(), size_ * sizeof *inst_);
}